

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::base_widget::message(base_widget *this,string *v)

{
  basic_message<char> *in_RSI;
  long in_RDI;
  string_type *id;
  string_type *in_stack_ffffffffffffff38;
  basic_message<char> *in_stack_ffffffffffffff40;
  undefined1 local_b1 [97];
  basic_message<char> *in_stack_ffffffffffffffb0;
  basic_message<char> *in_stack_ffffffffffffffb8;
  
  *(uint *)(in_RDI + 0x1f0) = *(uint *)(in_RDI + 0x1f0) | 0x20;
  id = (string_type *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_b1 + 1),"NOTRANS",(allocator *)id);
  booster::locale::basic_message<char>::basic_message
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,id);
  booster::locale::basic_message<char>::operator=
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  booster::locale::basic_message<char>::~basic_message(in_RSI);
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  return;
}

Assistant:

void base_widget::message(std::string v)
{
	has_message_ = 1;
	message_=locale::message("NOTRANS",v);
}